

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O1

void merged_2v_upsample(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                       JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                       JDIMENSION out_rows_avail)

{
  jpeg_upsampler *pjVar1;
  uint uVar2;
  uint uVar3;
  JDIMENSION num_cols;
  
  pjVar1 = cinfo->upsample;
  if (*(int *)&pjVar1[3].start_pass == 0) {
    uVar2 = out_rows_avail - *out_row_ctr;
    if (*(uint *)&pjVar1[3].upsample < out_rows_avail - *out_row_ctr) {
      uVar2 = *(uint *)&pjVar1[3].upsample;
    }
    uVar3 = 2;
    if (uVar2 < 2) {
      *(undefined4 *)&pjVar1[3].start_pass = 1;
      uVar3 = uVar2;
    }
    (*pjVar1[1].start_pass)(cinfo);
  }
  else {
    if (cinfo->out_color_space == JCS_RGB565) {
      num_cols = cinfo->output_width * 2;
    }
    else {
      num_cols = *(JDIMENSION *)((long)&pjVar1[3].start_pass + 4);
    }
    uVar3 = 1;
    jcopy_sample_rows((JSAMPARRAY)&pjVar1[2].need_context_rows,0,output_buf + *out_row_ctr,0,1,
                      num_cols);
    *(undefined4 *)&pjVar1[3].start_pass = 0;
  }
  *out_row_ctr = *out_row_ctr + uVar3;
  *(uint *)&pjVar1[3].upsample = *(int *)&pjVar1[3].upsample - uVar3;
  if (*(int *)&pjVar1[3].start_pass == 0) {
    *in_row_group_ctr = *in_row_group_ctr + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
merged_2v_upsample(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                   JDIMENSION *in_row_group_ctr,
                   JDIMENSION in_row_groups_avail, JSAMPARRAY output_buf,
                   JDIMENSION *out_row_ctr, JDIMENSION out_rows_avail)
/* 2:1 vertical sampling case: may need a spare row. */
{
  my_merged_upsample_ptr upsample = (my_merged_upsample_ptr)cinfo->upsample;
  JSAMPROW work_ptrs[2];
  JDIMENSION num_rows;          /* number of rows returned to caller */

  if (upsample->spare_full) {
    /* If we have a spare row saved from a previous cycle, just return it. */
    JDIMENSION size = upsample->out_row_width;
    if (cinfo->out_color_space == JCS_RGB565)
      size = cinfo->output_width * 2;
    jcopy_sample_rows(&upsample->spare_row, 0, output_buf + *out_row_ctr, 0, 1,
                      size);
    num_rows = 1;
    upsample->spare_full = FALSE;
  } else {
    /* Figure number of rows to return to caller. */
    num_rows = 2;
    /* Not more than the distance to the end of the image. */
    if (num_rows > upsample->rows_to_go)
      num_rows = upsample->rows_to_go;
    /* And not more than what the client can accept: */
    out_rows_avail -= *out_row_ctr;
    if (num_rows > out_rows_avail)
      num_rows = out_rows_avail;
    /* Create output pointer array for upsampler. */
    work_ptrs[0] = output_buf[*out_row_ctr];
    if (num_rows > 1) {
      work_ptrs[1] = output_buf[*out_row_ctr + 1];
    } else {
      work_ptrs[1] = upsample->spare_row;
      upsample->spare_full = TRUE;
    }
    /* Now do the upsampling. */
    (*upsample->upmethod) (cinfo, input_buf, *in_row_group_ctr, work_ptrs);
  }

  /* Adjust counts */
  *out_row_ctr += num_rows;
  upsample->rows_to_go -= num_rows;
  /* When the buffer is emptied, declare this input row group consumed */
  if (!upsample->spare_full)
    (*in_row_group_ctr)++;
}